

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O3

void __thiscall Model::LoadModel(Model *this,string *file)

{
  map<int,_Node,_std::less<int>,_std::allocator<std::pair<const_int,_Node>_>_> *this_00;
  pointer pcVar1;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aVar2;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aVar3;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar4;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 aVar5;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aVar6;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aVar7;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar8;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 aVar9;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aVar10;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aVar11;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar12;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 aVar13;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aVar14;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aVar15;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar16;
  pointer piVar17;
  mapped_type *pmVar18;
  mapped_type *pmVar19;
  mapped_type *pmVar20;
  long lVar21;
  undefined4 uVar22;
  Material *pMVar23;
  undefined8 *puVar24;
  long lVar25;
  ulong uVar26;
  byte bVar27;
  Model gltf_model;
  Model local_7ee0;
  undefined1 local_7ac8 [8];
  undefined1 local_7ac0 [32];
  vector<AnimationSampler,_std::allocator<AnimationSampler>_> local_7aa0;
  TextureInfo local_7a88;
  pointer pAStack_7a80;
  _Alloc_hider local_7a78;
  undefined1 local_7a70 [8];
  undefined1 local_7a68 [16];
  _Alloc_hider _Stack_7a58;
  pointer local_7a50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7a48 [6];
  vector<std::vector<Vertex,_std::allocator<Vertex>_>,_std::allocator<std::vector<Vertex,_std::allocator<Vertex>_>_>_>
  local_79e8;
  undefined1 local_79d0 [15408];
  pointer local_3da0;
  pointer puStack_3d98;
  pointer local_3d90;
  GLuint local_3d88;
  GLuint GStack_3d84;
  GLuint local_3d80;
  undefined1 local_3d78 [104];
  _Alloc_hider _Stack_3d10;
  pointer local_3d08;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d00 [6];
  vector<std::vector<Vertex,_std::allocator<Vertex>_>,_std::allocator<std::vector<Vertex,_std::allocator<Vertex>_>_>_>
  local_3ca0;
  undefined1 local_3c88 [15408];
  pointer local_58;
  pointer puStack_50;
  pointer local_48;
  GLuint local_40;
  GLuint GStack_3c;
  GLuint local_38;
  
  bVar27 = 0;
  tinygltf::Model::Model(&local_7ee0);
  LoadglTFModel(&local_7ee0,file);
  if (local_7ee0.meshes.super__Vector_base<tinygltf::Mesh,_std::allocator<tinygltf::Mesh>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_7ee0.meshes.super__Vector_base<tinygltf::Mesh,_std::allocator<tinygltf::Mesh>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pcVar1 = local_3d78 + 0x10;
    lVar25 = 0;
    uVar26 = 0;
    do {
      LoadglTFMesh((Mesh *)local_3d78,&local_7ee0,
                   (Mesh *)((long)&((local_7ee0.meshes.
                                     super__Vector_base<tinygltf::Mesh,_std::allocator<tinygltf::Mesh>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus.
                                   _M_p + lVar25));
      if ((pointer)local_3d78._0_8_ == pcVar1) {
        local_7ac0._24_8_ = local_3d78._24_8_;
        local_7ac0._0_8_ = local_7ac0 + 0x10;
      }
      else {
        local_7ac0._0_8_ = local_3d78._0_8_;
      }
      local_7ac0._17_7_ = local_3d78._17_7_;
      local_7ac0[0x10] = local_3d78[0x10];
      local_7ac0._8_8_ = local_3d78._8_8_;
      local_3d78._8_8_ = 0;
      local_3d78[0x10] = '\0';
      local_7aa0.super__Vector_base<AnimationSampler,_std::allocator<AnimationSampler>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_3d78._32_8_;
      local_7aa0.super__Vector_base<AnimationSampler,_std::allocator<AnimationSampler>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_3d78._40_8_;
      local_7aa0.super__Vector_base<AnimationSampler,_std::allocator<AnimationSampler>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_3d78._48_8_;
      local_3d78._48_8_ = (pointer)0x0;
      local_3d78._32_8_ = (pointer)0x0;
      local_3d78._40_4_ = 0;
      local_3d78._44_4_ = 0;
      local_7a88.index = local_3d78._56_4_;
      local_7a88.texCoord = local_3d78._60_4_;
      pAStack_7a80 = (pointer)local_3d78._64_8_;
      local_7a78._M_p = (pointer)local_3d78._72_8_;
      local_3d78._72_8_ = (pointer)0x0;
      local_3d78._56_4_ = 0;
      local_3d78._60_4_ = 0;
      local_3d78._64_8_ = (pointer)0x0;
      local_7ac8 = (undefined1  [8])uVar26;
      local_3d78._0_8_ = pcVar1;
      memcpy(local_7a70,local_3d78 + 0x50,0x88);
      local_79e8.
      super__Vector_base<std::vector<Vertex,_std::allocator<Vertex>_>,_std::allocator<std::vector<Vertex,_std::allocator<Vertex>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_3ca0.
           super__Vector_base<std::vector<Vertex,_std::allocator<Vertex>_>,_std::allocator<std::vector<Vertex,_std::allocator<Vertex>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_79e8.
      super__Vector_base<std::vector<Vertex,_std::allocator<Vertex>_>,_std::allocator<std::vector<Vertex,_std::allocator<Vertex>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_3ca0.
           super__Vector_base<std::vector<Vertex,_std::allocator<Vertex>_>,_std::allocator<std::vector<Vertex,_std::allocator<Vertex>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_79e8.
      super__Vector_base<std::vector<Vertex,_std::allocator<Vertex>_>,_std::allocator<std::vector<Vertex,_std::allocator<Vertex>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_3ca0.
           super__Vector_base<std::vector<Vertex,_std::allocator<Vertex>_>,_std::allocator<std::vector<Vertex,_std::allocator<Vertex>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_3ca0.
      super__Vector_base<std::vector<Vertex,_std::allocator<Vertex>_>,_std::allocator<std::vector<Vertex,_std::allocator<Vertex>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_3ca0.
      super__Vector_base<std::vector<Vertex,_std::allocator<Vertex>_>,_std::allocator<std::vector<Vertex,_std::allocator<Vertex>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_3ca0.
      super__Vector_base<std::vector<Vertex,_std::allocator<Vertex>_>,_std::allocator<std::vector<Vertex,_std::allocator<Vertex>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      memcpy(local_79d0,local_3c88,0x3c30);
      local_3da0 = local_58;
      puStack_3d98 = puStack_50;
      local_3d90 = local_48;
      local_48 = (pointer)0x0;
      local_58 = (pointer)0x0;
      puStack_50 = (pointer)0x0;
      local_3d80 = local_38;
      local_3d88 = local_40;
      GStack_3d84 = GStack_3c;
      file = (string *)local_7ac8;
      std::
      _Rb_tree<int,std::pair<int_const,Mesh>,std::_Select1st<std::pair<int_const,Mesh>>,std::less<int>,std::allocator<std::pair<int_const,Mesh>>>
      ::_M_emplace_unique<std::pair<unsigned_long,Mesh>>
                ((_Rb_tree<int,std::pair<int_const,Mesh>,std::_Select1st<std::pair<int_const,Mesh>>,std::less<int>,std::allocator<std::pair<int_const,Mesh>>>
                  *)&this->meshes,(pair<unsigned_long,_Mesh> *)file);
      if (local_3da0 != (pointer)0x0) {
        file = (string *)((long)local_3d90 - (long)local_3da0);
        operator_delete(local_3da0,(ulong)file);
      }
      std::
      vector<std::vector<Vertex,_std::allocator<Vertex>_>,_std::allocator<std::vector<Vertex,_std::allocator<Vertex>_>_>_>
      ::~vector(&local_79e8);
      if (local_7a88 != (TextureInfo)0x0) {
        file = (string *)(local_7a78._M_p + -(long)local_7a88);
        operator_delete((void *)local_7a88,(ulong)file);
      }
      if ((pointer)local_7aa0.
                   super__Vector_base<AnimationSampler,_std::allocator<AnimationSampler>_>._M_impl.
                   super__Vector_impl_data._M_start != (pointer)0x0) {
        file = (string *)
               ((long)local_7aa0.
                      super__Vector_base<AnimationSampler,_std::allocator<AnimationSampler>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage -
               (long)local_7aa0.
                     super__Vector_base<AnimationSampler,_std::allocator<AnimationSampler>_>._M_impl
                     .super__Vector_impl_data._M_start);
        operator_delete(local_7aa0.
                        super__Vector_base<AnimationSampler,_std::allocator<AnimationSampler>_>.
                        _M_impl.super__Vector_impl_data._M_start,(ulong)file);
      }
      if ((undefined1 *)local_7ac0._0_8_ != local_7ac0 + 0x10) {
        file = (string *)(local_7ac0._16_8_ + 1);
        operator_delete((void *)local_7ac0._0_8_,(ulong)file);
      }
      if (local_58 != (pointer)0x0) {
        file = (string *)((long)local_48 - (long)local_58);
        operator_delete(local_58,(ulong)file);
      }
      std::
      vector<std::vector<Vertex,_std::allocator<Vertex>_>,_std::allocator<std::vector<Vertex,_std::allocator<Vertex>_>_>_>
      ::~vector(&local_3ca0);
      if ((TextureInfo)local_3d78._56_8_ != (TextureInfo)0x0) {
        file = (string *)(local_3d78._72_8_ + -local_3d78._56_8_);
        operator_delete((void *)local_3d78._56_8_,(ulong)file);
      }
      if ((pointer)local_3d78._32_8_ != (pointer)0x0) {
        file = (string *)(local_3d78._48_8_ - local_3d78._32_8_);
        operator_delete((void *)local_3d78._32_8_,(ulong)file);
      }
      if ((pointer)local_3d78._0_8_ != pcVar1) {
        file = (string *)(CONCAT71(local_3d78._17_7_,local_3d78[0x10]) + 1);
        operator_delete((void *)local_3d78._0_8_,(ulong)file);
      }
      uVar26 = uVar26 + 1;
      lVar25 = lVar25 + 0x158;
    } while (uVar26 < (ulong)(((long)local_7ee0.meshes.
                                     super__Vector_base<tinygltf::Mesh,_std::allocator<tinygltf::Mesh>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_7ee0.meshes.
                                     super__Vector_base<tinygltf::Mesh,_std::allocator<tinygltf::Mesh>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x7d05f417d05f417d));
  }
  lVar25 = (long)local_7ee0.defaultScene;
  piVar17 = local_7ee0.scenes.super__Vector_base<tinygltf::Scene,_std::allocator<tinygltf::Scene>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar25].nodes.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if (local_7ee0.scenes.super__Vector_base<tinygltf::Scene,_std::allocator<tinygltf::Scene>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar25].nodes.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
      piVar17) {
    uVar26 = 0;
    do {
      file = (string *)
             (local_7ee0.nodes.super__Vector_base<tinygltf::Node,_std::allocator<tinygltf::Node>_>.
              _M_impl.super__Vector_impl_data._M_start + piVar17[uVar26]);
      LoadglTFNode(&local_7ee0,(Node *)file,-1,piVar17[uVar26],&this->nodes);
      uVar26 = uVar26 + 1;
      piVar17 = local_7ee0.scenes.
                super__Vector_base<tinygltf::Scene,_std::allocator<tinygltf::Scene>_>._M_impl.
                super__Vector_impl_data._M_start[lVar25].nodes.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
    } while (uVar26 < (ulong)((long)local_7ee0.scenes.
                                    super__Vector_base<tinygltf::Scene,_std::allocator<tinygltf::Scene>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar25].nodes.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)piVar17 >> 2));
  }
  if ((this->nodes)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    this_00 = &this->nodes;
    uVar26 = 0;
    do {
      uVar22 = (undefined4)uVar26;
      local_7ac8._0_4_ = uVar22;
      file = (string *)local_7ac8;
      pmVar18 = std::map<int,_Node,_std::less<int>,_std::allocator<std::pair<const_int,_Node>_>_>::
                operator[](this_00,(key_type *)local_7ac8);
      if (-1 < pmVar18->mesh_id) {
        pmVar18 = std::map<int,_Node,_std::less<int>,_std::allocator<std::pair<const_int,_Node>_>_>
                  ::operator[](this_00,(key_type *)local_7ac8);
        local_3d78._0_4_ = uVar22;
        pmVar19 = std::map<int,_Node,_std::less<int>,_std::allocator<std::pair<const_int,_Node>_>_>
                  ::operator[](this_00,(key_type *)local_3d78);
        file = (string *)&pmVar19->mesh_id;
        pmVar20 = std::map<int,_Mesh,_std::less<int>,_std::allocator<std::pair<const_int,_Mesh>_>_>
                  ::operator[](&this->meshes,(key_type *)file);
        aVar13 = (pmVar18->matrix).value[0].field_0;
        aVar14 = (pmVar18->matrix).value[0].field_1;
        aVar15 = (pmVar18->matrix).value[0].field_2;
        aVar16 = (pmVar18->matrix).value[0].field_3;
        aVar9 = (pmVar18->matrix).value[1].field_0;
        aVar10 = (pmVar18->matrix).value[1].field_1;
        aVar11 = (pmVar18->matrix).value[1].field_2;
        aVar12 = (pmVar18->matrix).value[1].field_3;
        aVar5 = (pmVar18->matrix).value[2].field_0;
        aVar6 = (pmVar18->matrix).value[2].field_1;
        aVar7 = (pmVar18->matrix).value[2].field_2;
        aVar8 = (pmVar18->matrix).value[2].field_3;
        aVar2 = (pmVar18->matrix).value[3].field_1;
        aVar3 = (pmVar18->matrix).value[3].field_2;
        aVar4 = (pmVar18->matrix).value[3].field_3;
        (pmVar20->matrix).value[3].field_0 = (pmVar18->matrix).value[3].field_0;
        (pmVar20->matrix).value[3].field_1 = aVar2;
        (pmVar20->matrix).value[3].field_2 = aVar3;
        (pmVar20->matrix).value[3].field_3 = aVar4;
        (pmVar20->matrix).value[2].field_0 = aVar5;
        (pmVar20->matrix).value[2].field_1 = aVar6;
        (pmVar20->matrix).value[2].field_2 = aVar7;
        (pmVar20->matrix).value[2].field_3 = aVar8;
        (pmVar20->matrix).value[1].field_0 = aVar9;
        (pmVar20->matrix).value[1].field_1 = aVar10;
        (pmVar20->matrix).value[1].field_2 = aVar11;
        (pmVar20->matrix).value[1].field_3 = aVar12;
        (pmVar20->matrix).value[0].field_0 = aVar13;
        (pmVar20->matrix).value[0].field_1 = aVar14;
        (pmVar20->matrix).value[0].field_2 = aVar15;
        (pmVar20->matrix).value[0].field_3 = aVar16;
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 < (this->nodes)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  if (local_7ee0.textures.super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_7ee0.textures.super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar25 = 0;
    uVar26 = 0;
    do {
      LoadglTFTexture((Texture *)local_3d78,&local_7ee0,
                      (Texture *)
                      ((long)&((local_7ee0.textures.
                                super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>
                                ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                      lVar25));
      local_7ac8 = (undefined1  [8])uVar26;
      Texture::Texture((Texture *)local_7ac0,(Texture *)local_3d78);
      file = (string *)local_7ac8;
      std::
      _Rb_tree<int,std::pair<int_const,Texture>,std::_Select1st<std::pair<int_const,Texture>>,std::less<int>,std::allocator<std::pair<int_const,Texture>>>
      ::_M_emplace_unique<std::pair<unsigned_long,Texture>>
                ((_Rb_tree<int,std::pair<int_const,Texture>,std::_Select1st<std::pair<int_const,Texture>>,std::less<int>,std::allocator<std::pair<int_const,Texture>>>
                  *)&this->textures,(pair<unsigned_long,_Texture> *)local_7ac8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Stack_7a58._M_p != local_7a48) {
        file = (string *)
               (CONCAT44(local_7a48[0]._M_allocated_capacity._4_4_,
                         (undefined4)local_7a48[0]._M_allocated_capacity) + 1);
        operator_delete(_Stack_7a58._M_p,(ulong)file);
      }
      if (local_7a78._M_p != local_7a68) {
        file = (string *)(local_7a68._0_8_ + 1);
        operator_delete(local_7a78._M_p,(ulong)file);
      }
      if ((pointer)local_7aa0.
                   super__Vector_base<AnimationSampler,_std::allocator<AnimationSampler>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        file = (string *)
               ((long)pAStack_7a80 -
               (long)local_7aa0.
                     super__Vector_base<AnimationSampler,_std::allocator<AnimationSampler>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage);
        operator_delete(local_7aa0.
                        super__Vector_base<AnimationSampler,_std::allocator<AnimationSampler>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)file);
      }
      if ((undefined1 *)local_7ac0._0_8_ != local_7ac0 + 0x10) {
        file = (string *)(local_7ac0._16_8_ + 1);
        operator_delete((void *)local_7ac0._0_8_,(ulong)file);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Stack_3d10._M_p != local_3d00) {
        file = (string *)
               (CONCAT44(local_3d00[0]._M_allocated_capacity._4_4_,
                         (undefined4)local_3d00[0]._M_allocated_capacity) + 1);
        operator_delete(_Stack_3d10._M_p,(ulong)file);
      }
      if ((undefined1 *)local_3d78._72_8_ != local_3d78 + 0x58) {
        file = (string *)(local_3d78._88_8_ + 1);
        operator_delete((void *)local_3d78._72_8_,(ulong)file);
      }
      if ((pointer)local_3d78._48_8_ != (pointer)0x0) {
        file = (string *)(local_3d78._64_8_ - local_3d78._48_8_);
        operator_delete((void *)local_3d78._48_8_,(ulong)file);
      }
      if ((undefined1 *)local_3d78._0_8_ != local_3d78 + 0x10) {
        file = (string *)(CONCAT71(local_3d78._17_7_,local_3d78[0x10]) + 1);
        operator_delete((void *)local_3d78._0_8_,(ulong)file);
      }
      uVar26 = uVar26 + 1;
      lVar25 = lVar25 + 0x130;
    } while (uVar26 < (ulong)(((long)local_7ee0.textures.
                                     super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_7ee0.textures.
                                     super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4) *
                             -0x79435e50d79435e5));
  }
  if (local_7ee0.materials.
      super__Vector_base<tinygltf::Material,_std::allocator<tinygltf::Material>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_7ee0.materials.
      super__Vector_base<tinygltf::Material,_std::allocator<tinygltf::Material>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar25 = 0;
    uVar26 = 0;
    do {
      LoadglTFMaterial((Material *)local_3d78,(Model *)file,
                       (Material *)
                       ((long)&((local_7ee0.materials.
                                 super__Vector_base<tinygltf::Material,_std::allocator<tinygltf::Material>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p
                       + lVar25));
      pMVar23 = (Material *)local_3d78;
      puVar24 = (undefined8 *)local_7ac0;
      for (lVar21 = 0xc; lVar21 != 0; lVar21 = lVar21 + -1) {
        *puVar24 = *(undefined8 *)&pMVar23->emissive_factor;
        pMVar23 = (Material *)((long)pMVar23 + (ulong)bVar27 * -0x10 + 8);
        puVar24 = puVar24 + (ulong)bVar27 * -2 + 1;
      }
      local_7a68._8_8_ = local_3d78._96_8_;
      _Stack_7a58._M_p = _Stack_3d10._M_p;
      local_7a50 = local_3d08;
      local_3d78._96_4_ = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
      local_3d78._100_4_ = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
      _Stack_3d10._M_p = (pointer)0x0;
      local_3d08 = (pointer)0x0;
      local_7a48[0]._M_allocated_capacity._0_4_ = (undefined4)local_3d00[0]._M_allocated_capacity;
      file = (string *)local_7ac8;
      local_7ac8 = (undefined1  [8])uVar26;
      std::
      _Rb_tree<int,std::pair<int_const,Material>,std::_Select1st<std::pair<int_const,Material>>,std::less<int>,std::allocator<std::pair<int_const,Material>>>
      ::_M_emplace_unique<std::pair<unsigned_long,Material>>
                ((_Rb_tree<int,std::pair<int_const,Material>,std::_Select1st<std::pair<int_const,Material>>,std::less<int>,std::allocator<std::pair<int_const,Material>>>
                  *)&this->materials,(pair<unsigned_long,_Material> *)file);
      std::vector<std::shared_ptr<Extension>,_std::allocator<std::shared_ptr<Extension>_>_>::~vector
                ((vector<std::shared_ptr<Extension>,_std::allocator<std::shared_ptr<Extension>_>_> *
                 )(local_7a68 + 8));
      std::vector<std::shared_ptr<Extension>,_std::allocator<std::shared_ptr<Extension>_>_>::~vector
                ((vector<std::shared_ptr<Extension>,_std::allocator<std::shared_ptr<Extension>_>_> *
                 )(local_3d78 + 0x60));
      uVar26 = uVar26 + 1;
      lVar25 = lVar25 + 0x860;
    } while (uVar26 < (ulong)(((long)local_7ee0.materials.
                                     super__Vector_base<tinygltf::Material,_std::allocator<tinygltf::Material>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_7ee0.materials.
                                     super__Vector_base<tinygltf::Material,_std::allocator<tinygltf::Material>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5) *
                             -0xf4898d5f85bb395));
  }
  if (local_7ee0.animations.
      super__Vector_base<tinygltf::Animation,_std::allocator<tinygltf::Animation>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_7ee0.animations.
      super__Vector_base<tinygltf::Animation,_std::allocator<tinygltf::Animation>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar25 = 0;
    uVar26 = 0;
    do {
      LoadglTFAnimation((Animation *)local_3d78,&local_7ee0,
                        (Animation *)
                        ((long)&((local_7ee0.animations.
                                  super__Vector_base<tinygltf::Animation,_std::allocator<tinygltf::Animation>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p
                        + lVar25));
      local_7ac8 = (undefined1  [8])uVar26;
      Animation::Animation((Animation *)local_7ac0,(Animation *)local_3d78);
      std::
      _Rb_tree<int,std::pair<int_const,Animation>,std::_Select1st<std::pair<int_const,Animation>>,std::less<int>,std::allocator<std::pair<int_const,Animation>>>
      ::_M_emplace_unique<std::pair<unsigned_long,Animation>>
                ((_Rb_tree<int,std::pair<int_const,Animation>,std::_Select1st<std::pair<int_const,Animation>>,std::less<int>,std::allocator<std::pair<int_const,Animation>>>
                  *)&this->animations,(pair<unsigned_long,_Animation> *)local_7ac8);
      if (local_7a88 != (TextureInfo)0x0) {
        operator_delete((void *)local_7a88,(long)local_7a78._M_p - (long)local_7a88);
      }
      std::vector<AnimationSampler,_std::allocator<AnimationSampler>_>::~vector(&local_7aa0);
      if ((undefined1 *)local_7ac0._0_8_ != local_7ac0 + 0x10) {
        operator_delete((void *)local_7ac0._0_8_,local_7ac0._16_8_ + 1);
      }
      if ((TextureInfo)local_3d78._56_8_ != (TextureInfo)0x0) {
        operator_delete((void *)local_3d78._56_8_,local_3d78._72_8_ - local_3d78._56_8_);
      }
      std::vector<AnimationSampler,_std::allocator<AnimationSampler>_>::~vector
                ((vector<AnimationSampler,_std::allocator<AnimationSampler>_> *)(local_3d78 + 0x20))
      ;
      if ((undefined1 *)local_3d78._0_8_ != local_3d78 + 0x10) {
        operator_delete((void *)local_3d78._0_8_,CONCAT71(local_3d78._17_7_,local_3d78[0x10]) + 1);
      }
      uVar26 = uVar26 + 1;
      lVar25 = lVar25 + 0x158;
    } while (uVar26 < (ulong)(((long)local_7ee0.animations.
                                     super__Vector_base<tinygltf::Animation,_std::allocator<tinygltf::Animation>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_7ee0.animations.
                                     super__Vector_base<tinygltf::Animation,_std::allocator<tinygltf::Animation>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x7d05f417d05f417d));
  }
  if (local_7ee0.skins.super__Vector_base<tinygltf::Skin,_std::allocator<tinygltf::Skin>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_7ee0.skins.super__Vector_base<tinygltf::Skin,_std::allocator<tinygltf::Skin>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar25 = 0;
    uVar26 = 0;
    do {
      LoadglTFSkin((Skin *)local_3d78,&local_7ee0,
                   (Skin *)((long)&((local_7ee0.skins.
                                     super__Vector_base<tinygltf::Skin,_std::allocator<tinygltf::Skin>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus.
                                   _M_p + lVar25));
      local_7ac8 = (undefined1  [8])uVar26;
      Skin::Skin((Skin *)local_7ac0,(Skin *)local_3d78);
      std::
      _Rb_tree<int,std::pair<int_const,Skin>,std::_Select1st<std::pair<int_const,Skin>>,std::less<int>,std::allocator<std::pair<int_const,Skin>>>
      ::_M_emplace_unique<std::pair<unsigned_long,Skin>>
                ((_Rb_tree<int,std::pair<int_const,Skin>,std::_Select1st<std::pair<int_const,Skin>>,std::less<int>,std::allocator<std::pair<int_const,Skin>>>
                  *)&this->skins,(pair<unsigned_long,_Skin> *)local_7ac8);
      if (local_7a88 != (TextureInfo)0x0) {
        operator_delete((void *)local_7a88,(long)local_7a78._M_p - (long)local_7a88);
      }
      if ((pointer)local_7aa0.
                   super__Vector_base<AnimationSampler,_std::allocator<AnimationSampler>_>._M_impl.
                   super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_7aa0.
                        super__Vector_base<AnimationSampler,_std::allocator<AnimationSampler>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_7aa0.
                              super__Vector_base<AnimationSampler,_std::allocator<AnimationSampler>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_7aa0.
                              super__Vector_base<AnimationSampler,_std::allocator<AnimationSampler>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((undefined1 *)local_7ac0._0_8_ != local_7ac0 + 0x10) {
        operator_delete((void *)local_7ac0._0_8_,local_7ac0._16_8_ + 1);
      }
      if ((TextureInfo)local_3d78._56_8_ != (TextureInfo)0x0) {
        operator_delete((void *)local_3d78._56_8_,local_3d78._72_8_ - local_3d78._56_8_);
      }
      if ((pointer)local_3d78._32_8_ != (pointer)0x0) {
        operator_delete((void *)local_3d78._32_8_,local_3d78._48_8_ - local_3d78._32_8_);
      }
      if ((undefined1 *)local_3d78._0_8_ != local_3d78 + 0x10) {
        operator_delete((void *)local_3d78._0_8_,CONCAT71(local_3d78._17_7_,local_3d78[0x10]) + 1);
      }
      uVar26 = uVar26 + 1;
      lVar25 = lVar25 + 0x148;
    } while (uVar26 < (ulong)(((long)local_7ee0.skins.
                                     super__Vector_base<tinygltf::Skin,_std::allocator<tinygltf::Skin>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_7ee0.skins.
                                     super__Vector_base<tinygltf::Skin,_std::allocator<tinygltf::Skin>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x7063e7063e7063e7));
  }
  tinygltf::Model::~Model(&local_7ee0);
  return;
}

Assistant:

void Model::LoadModel(const std::string &file) {
    tinygltf::Model gltf_model;
    LoadglTFModel(gltf_model, file);

    /* load the mesh data */
    for (std::size_t i = 0; i < gltf_model.meshes.size(); ++i) {
        meshes.insert(std::make_pair(i, LoadglTFMesh(gltf_model, gltf_model.meshes[i])));
    }

    /* load the node data                                */
    /* NOTE: only store node data from the default scene */
    const tinygltf::Scene &scene = gltf_model.scenes[gltf_model.defaultScene];
    for (std::size_t i = 0; i < scene.nodes.size(); ++i) {
        LoadglTFNode(gltf_model, gltf_model.nodes[scene.nodes[i]], -1, scene.nodes[i], nodes);
    }

    /* save the matrix information of the mesh */
    for (std::size_t i = 0; i < nodes.size(); ++i) {
        if (nodes[i].mesh_id > -1) {
            meshes[nodes[i].mesh_id].matrix = nodes[i].matrix;
        }
    }

    /* load the texture data */
    for (std::size_t i = 0; i < gltf_model.textures.size(); ++i) {
        textures.insert(std::make_pair(i, LoadglTFTexture(gltf_model, gltf_model.textures[i])));
    }

    /* load the material data */
    for (std::size_t i = 0; i < gltf_model.materials.size(); ++i) {
        materials.insert(std::make_pair(i, LoadglTFMaterial(gltf_model, gltf_model.materials[i])));
    }

    /* load the animation data */
    for (std::size_t i = 0; i < gltf_model.animations.size(); ++i) {
        animations.insert(std::make_pair(i, LoadglTFAnimation(gltf_model, gltf_model.animations[i])));
    }

    /* load the skin data */
    for (std::size_t i = 0; i < gltf_model.skins.size(); ++i) {
        skins.insert(std::make_pair(i, LoadglTFSkin(gltf_model, gltf_model.skins[i])));
    }
}